

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool __thiscall
kj::ArrayPtr<const_char>::operator==(ArrayPtr<const_char> *this,ArrayPtr<const_char> *other)

{
  int iVar1;
  ArrayPtr<const_char> *other_local;
  ArrayPtr<const_char> *this_local;
  
  if (this->size_ == other->size_) {
    if (this->size_ == 0) {
      this_local._7_1_ = true;
    }
    else {
      iVar1 = memcmp(this->ptr,other->ptr,this->size_);
      this_local._7_1_ = iVar1 == 0;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline constexpr bool operator==(const ArrayPtr& other) const {
    if (size_ != other.size_) return false;
#if KJ_HAS_COMPILER_FEATURE(cxx_constexpr_string_builtins)
    if (isIntegral<RemoveConst<T>>()) {
      if (size_ == 0) return true;
      return __builtin_memcmp(ptr, other.ptr, size_ * sizeof(T)) == 0;
    }
#endif
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }